

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_process_anchor(yaml_emitter_t *emitter)

{
  int iVar1;
  char *indicator;
  yaml_emitter_t *emitter_local;
  
  if ((emitter->anchor_data).anchor == (yaml_char_t *)0x0) {
    emitter_local._4_4_ = 1;
  }
  else {
    indicator = "&";
    if ((emitter->anchor_data).alias != 0) {
      indicator = "*";
    }
    iVar1 = yaml_emitter_write_indicator(emitter,indicator,1,0,0);
    if (iVar1 == 0) {
      emitter_local._4_4_ = 0;
    }
    else {
      emitter_local._4_4_ =
           yaml_emitter_write_anchor
                     (emitter,(emitter->anchor_data).anchor,(emitter->anchor_data).anchor_length);
    }
  }
  return emitter_local._4_4_;
}

Assistant:

static int
yaml_emitter_process_anchor(yaml_emitter_t *emitter)
{
    if (!emitter->anchor_data.anchor)
        return 1;

    if (!yaml_emitter_write_indicator(emitter,
                (emitter->anchor_data.alias ? "*" : "&"), 1, 0, 0))
        return 0;

    return yaml_emitter_write_anchor(emitter,
            emitter->anchor_data.anchor, emitter->anchor_data.anchor_length);
}